

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preview.c
# Opt level: O2

exr_result_t
exr_attr_preview_create(exr_context_t ctxt,exr_attr_preview_t *p,uint32_t w,uint32_t h,uint8_t *d)

{
  exr_result_t eVar1;
  
  eVar1 = exr_attr_preview_init(ctxt,p,w,h);
  if ((eVar1 == 0) && ((w * h & 0x3fffffff) != 0)) {
    memcpy(p->rgba,d,(ulong)(w * h * 4));
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_preview_create (
    exr_context_t       ctxt,
    exr_attr_preview_t* p,
    uint32_t            w,
    uint32_t            h,
    const uint8_t*      d)
{
    exr_result_t rv = exr_attr_preview_init (ctxt, p, w, h);
    if (rv == EXR_ERR_SUCCESS)
    {
        size_t copybytes = w * h * 4;
        if (copybytes > 0)
            memcpy (EXR_CONST_CAST (uint8_t*, p->rgba), d, copybytes);
    }
    return rv;
}